

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

Vec_Wec_t * Abc_GraphFrontiers(Vec_Int_t *vEdges,Vec_Int_t *vLife)

{
  int iVar1;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *vVec1;
  int *pNodes;
  int n;
  int e;
  Vec_Int_t *vTemp;
  Vec_Wec_t *vFronts;
  Vec_Int_t *vLife_local;
  Vec_Int_t *vEdges_local;
  
  iVar1 = Vec_IntSize(vEdges);
  p = Vec_WecAlloc(iVar1 / 2);
  iVar1 = Vec_IntSize(vLife);
  p_00 = Vec_IntAlloc(iVar1 / 2);
  Vec_WecPushLevel(p);
  for (pNodes._4_4_ = 0; iVar1 = Vec_IntSize(vEdges), pNodes._4_4_ < iVar1 / 2;
      pNodes._4_4_ = pNodes._4_4_ + 1) {
    piVar2 = Vec_IntEntryP(vEdges,pNodes._4_4_ << 1);
    for (pNodes._0_4_ = 0; (int)pNodes < 2; pNodes._0_4_ = (int)pNodes + 1) {
      iVar1 = Vec_IntEntry(vLife,piVar2[(int)pNodes] << 1);
      if (iVar1 == pNodes._4_4_) {
        Vec_IntPush(p_00,piVar2[(int)pNodes]);
      }
      else {
        iVar1 = Vec_IntEntry(vLife,piVar2[(int)pNodes] * 2 + 1);
        if (iVar1 == pNodes._4_4_) {
          Vec_IntRemove(p_00,piVar2[(int)pNodes]);
        }
      }
    }
    vVec1 = Vec_WecPushLevel(p);
    Vec_IntAppend(vVec1,p_00);
  }
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Vec_Wec_t * Abc_GraphFrontiers( Vec_Int_t * vEdges, Vec_Int_t * vLife )
{
    Vec_Wec_t * vFronts = Vec_WecAlloc( Vec_IntSize(vEdges)/2 ); // front for each edge
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vLife)/2 );
    int e, n;    
    Vec_WecPushLevel(vFronts);
    for ( e = 0; e < Vec_IntSize(vEdges)/2; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        for ( n = 0; n < 2; n++ )
            if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
                Vec_IntPush( vTemp, pNodes[n] );
            else if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
                Vec_IntRemove( vTemp, pNodes[n] );
        Vec_IntAppend( Vec_WecPushLevel(vFronts), vTemp );
    }
    //Vec_WecPrint( vFronts, 0 );
    Vec_IntFree( vTemp );
    return vFronts;
}